

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

DecompressResult
tcu::astc::anon_unknown_0::decompressBlock
          (void *dst,Block128 *blockData,int blockWidth,int blockHeight,bool isSRGB,bool isLDR)

{
  ColorEndpointPair *e0;
  deUint32 dVar1;
  Word WVar2;
  int iVar3;
  sbyte sVar4;
  bool bVar5;
  void *pvVar6;
  deFloat16 val16;
  int i;
  uint uVar7;
  int iVar8;
  DecompressResult DVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  InternalError *this;
  ISEParams IVar14;
  long lVar15;
  undefined1 *puVar16;
  byte bVar17;
  ulong uVar18;
  uint *puVar19;
  byte bVar20;
  uint uVar21;
  undefined4 in_register_00000014;
  ulong uVar22;
  deUint32 *pdVar23;
  int weightNdx_1;
  int iVar24;
  byte bVar25;
  deUint32 dVar26;
  undefined1 uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  undefined7 in_register_00000081;
  ulong uVar32;
  undefined7 in_register_00000089;
  uint uVar33;
  int c_1;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  UVec4 *e1;
  uint uVar38;
  uint uVar39;
  bool bVar40;
  bool bVar41;
  float fVar42;
  int local_a80;
  deInt32 v2;
  undefined8 local_a68;
  ulong local_a60;
  uint local_a58;
  deInt32 v3;
  ulong local_a50;
  uint local_a44;
  undefined4 local_a40;
  deInt32 v4;
  ulong local_a38;
  ulong local_a30;
  uint local_a24;
  ulong local_a20;
  ASTCBlockMode blockMode;
  deInt32 v5;
  void *local_a00;
  undefined8 local_9f8;
  uint local_9ec;
  uint local_9e8;
  undefined4 local_9e4;
  deUint32 local_9e0 [2];
  ulong local_9d8;
  deInt32 v1;
  int local_9cc;
  uint local_9c8;
  undefined4 local_9c4;
  ulong local_9c0;
  uint local_9b8;
  deInt32 v6;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  UVec4 *local_998;
  ulong local_990;
  undefined4 local_984;
  ulong local_980;
  ulong local_978;
  int local_970;
  uint local_96c;
  uint local_968;
  uint local_964;
  uint local_960;
  uint local_95c;
  deUint32 colorEndpointModes [4];
  ISEParams local_940;
  deInt32 v0;
  int iStack_934;
  int aiStack_930 [62];
  ColorEndpointPair colorEndpoints [4];
  deUint32 rgba [4];
  bool local_7a8 [4];
  int local_7a4;
  deUint32 local_7a0;
  uint local_79c [185];
  TexelWeightPair texelWeights [144];
  
  local_a20 = CONCAT44(in_register_00000014,blockWidth);
  local_a40 = (undefined4)CONCAT71(in_register_00000081,isSRGB);
  uVar35 = (ulong)(uint)blockHeight;
  uVar37 = blockData->m_words[0];
  uVar34 = (uint)uVar37;
  uVar18 = uVar37 & 0xffffffff;
  blockMode.isError = true;
  blockMode.isVoidExtent = (uVar34 & 0x1ff) == 0x1fc;
  local_a00 = dst;
  local_9e0 = (deUint32  [2])blockData;
  if (blockMode.isVoidExtent) {
    if (((byte)(uVar37 >> 9) & isLDR) == 0) {
      uVar21 = (uint)(uVar37 >> 0x19) & 0x1fff;
      uVar7 = (uint)(uVar37 >> 0x20);
      uVar30 = uVar7 >> 0x13;
      uVar7 = uVar7 >> 6;
      if (((uVar30 == 0x1fff) && ((uVar34 >> 0xc & uVar7 & uVar21) == 0x1fff)) ||
         ((uVar34 >> 0xc & 0x1fff) < uVar21 && (uVar7 & 0x1fff) < uVar30)) {
        WVar2 = blockData->m_words[1];
        rgba._0_8_ = CONCAT44((int)(WVar2 >> 0x10),(int)WVar2) & 0xffff0000ffff;
        rgba[2] = (uint)(WVar2 >> 0x20) & 0xffff;
        rgba[3] = (uint)(ushort)(WVar2 >> 0x30);
        if (isSRGB) {
          uVar35 = 0;
          uVar37 = (ulong)(uint)(blockHeight * blockWidth);
          if (blockHeight * blockWidth < 1) {
            uVar37 = uVar35;
          }
          for (uVar18 = 0; uVar18 != uVar37; uVar18 = uVar18 + 1) {
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              *(undefined1 *)((long)dst + lVar29 + (int)uVar35) =
                   *(undefined1 *)((long)rgba + lVar29 * 4 + 1);
            }
            uVar35 = (ulong)((int)uVar35 + 4);
          }
        }
        else if ((uVar34 >> 9 & 1) == 0) {
          uVar35 = 0;
          uVar37 = (ulong)(uint)(blockHeight * blockWidth);
          if (blockHeight * blockWidth < 1) {
            uVar37 = uVar35;
          }
          for (uVar18 = 0; uVar18 != uVar37; uVar18 = uVar18 + 1) {
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              fVar42 = 1.0;
              if (rgba[lVar29] != 0xffff) {
                fVar42 = (float)rgba[lVar29] * 1.5258789e-05;
              }
              *(float *)((long)dst + lVar29 * 4 + (long)(int)uVar35 * 4) = fVar42;
            }
            uVar35 = (ulong)((int)uVar35 + 4);
          }
        }
        else {
          lVar29 = 0;
          while (lVar29 != 4) {
            puVar19 = rgba + lVar29;
            lVar29 = lVar29 + 1;
            if ((~*puVar19 & 0x7c00) == 0) {
              this = (InternalError *)__cxa_allocate_exception(0x38);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)texelWeights,
                         "Infinity or NaN color component in HDR void extent block in ASTC texture (behavior undefined by ASTC specification)"
                         ,(allocator<char> *)&v0);
              InternalError::InternalError(this,(string *)texelWeights);
              __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
            }
          }
          iVar24 = 0;
          uVar34 = blockHeight * blockWidth;
          if (blockHeight * blockWidth < 1) {
            uVar34 = 0;
          }
          for (uVar37 = 0; pvVar6 = local_a00, uVar37 != uVar34; uVar37 = uVar37 + 1) {
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              fVar42 = deFloat16To32((deFloat16)rgba[lVar29]);
              *(float *)((long)pvVar6 + lVar29 * 4 + (long)iVar24 * 4) = fVar42;
            }
            iVar24 = iVar24 + 4;
          }
        }
        return DECOMPRESS_RESULT_VALID_BLOCK;
      }
    }
    goto LAB_01627606;
  }
  local_984 = (undefined4)CONCAT71(in_register_00000089,isLDR);
  uVar7 = uVar34 & 0x7ff;
  uVar22 = 2;
  if ((uVar37 & 3) != 0) {
    if ((uVar37 & 0xf) == 0) goto LAB_01627606;
    uVar21 = (uint)(uVar18 >> 2) & 3;
    uVar30 = (uint)(uVar18 >> 5) & 3;
    if (uVar21 == 3) {
      uVar21 = uVar7 >> 7 & 1;
      bVar40 = (uVar34 >> 8 & 1) == 0;
      blockMode.weightGridWidth = uVar21 + 2;
      if (bVar40) {
        blockMode.weightGridWidth = uVar30 + 2;
      }
      local_a30 = (ulong)(uint)blockMode.weightGridWidth;
      uVar21 = uVar21 | 6;
      if (!bVar40) {
        uVar21 = uVar30 + 2;
      }
      local_9b0 = (ulong)uVar21;
    }
    else {
      uVar33 = uVar7 >> 7 & 3;
      if (uVar21 == 2) {
        blockMode.weightGridWidth = uVar30 + 2;
        local_a30 = (ulong)(uint)blockMode.weightGridWidth;
        local_9b0 = (ulong)(uVar33 | 8);
      }
      else {
        if (uVar21 == 1) {
          blockMode.weightGridWidth = uVar33 | 8;
        }
        else {
          blockMode.weightGridWidth = uVar33 | 4;
        }
        local_a30 = (ulong)(uint)blockMode.weightGridWidth;
        local_9b0 = (ulong)(uVar30 + 2);
      }
    }
    uVar30 = ((uint)(uVar18 >> 4) & 1) + (uVar34 & 3) * 2;
    blockMode.weightGridHeight = (int)local_9b0;
LAB_01627099:
    local_9f8 = CONCAT44(local_9f8._4_4_,uVar7 >> 10);
    blockMode.isDualPlane = SUB41(uVar7 >> 10,0);
    if ((uVar34 >> 9 & 1) == 0) goto LAB_0162721f;
    switch(uVar30) {
    case 2:
      blockMode.weightISEParams = (ISEParams)&DAT_100000001;
      uVar22 = 1;
      local_a68 = CONCAT44(local_a68._4_4_,1);
      bVar5 = false;
      bVar40 = true;
      local_a80 = 1;
      break;
    case 3:
      blockMode.weightISEParams.mode = ISEMODE_TRIT;
      blockMode.weightISEParams.numBits = 2;
      bVar5 = false;
      bVar40 = true;
      local_a68 = (ulong)local_a68._4_4_ << 0x20;
      goto LAB_01627314;
    case 4:
      blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
      blockMode.weightISEParams.numBits = 4;
      uVar22 = 4;
      goto LAB_016272a6;
    case 5:
      local_a80 = 1;
      blockMode.weightISEParams.mode = ISEMODE_QUINT;
      blockMode.weightISEParams.numBits = 2;
      bVar40 = true;
      bVar5 = false;
      local_a68 = (ulong)local_a68._4_4_ << 0x20;
      break;
    case 6:
      blockMode.weightISEParams.mode = ISEMODE_TRIT;
      blockMode.weightISEParams.numBits = 3;
      bVar5 = false;
      bVar40 = true;
      local_a68 = (ulong)local_a68._4_4_ << 0x20;
      uVar22 = 3;
      goto LAB_01627314;
    case 7:
      uVar22 = 5;
      blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
      blockMode.weightISEParams.numBits = 5;
LAB_016272a6:
      bVar5 = false;
      local_a68 = (ulong)local_a68._4_4_ << 0x20;
      goto LAB_0162730c;
    default:
      goto switchD_016270d7_default;
    }
    goto LAB_0162731d;
  }
  if ((uVar37 & 0xc) == 0 || (~uVar34 & 0x1c0) == 0) goto LAB_01627606;
  uVar30 = (uint)(uVar18 >> 7) & 3;
  if (uVar30 == 3) {
    blockMode.weightGridWidth = ((uVar34 & 0x20) >> 3) + 6;
    local_a30 = (ulong)(uint)blockMode.weightGridWidth;
    local_9b0 = (ulong)((uint)((uVar37 & 0x20) == 0) * 4 + 6);
  }
  else {
    uVar21 = (uint)(uVar18 >> 5) & 3;
    if (uVar30 == 2) {
      blockMode.weightGridWidth = uVar21 + 6;
      uVar30 = (uVar7 >> 9) + 6;
    }
    else {
      if (uVar30 != 1) {
        local_a30 = 0xc;
        blockMode.weightGridWidth = 0xc;
        local_9b0 = (ulong)(uVar21 + 2);
        goto LAB_016271e9;
      }
      blockMode.weightGridWidth = uVar21 + 2;
      uVar30 = 0xc;
    }
    local_a30 = (ulong)(uint)blockMode.weightGridWidth;
    local_9b0 = (ulong)uVar30;
  }
LAB_016271e9:
  uVar30 = (uint)(uVar18 >> 1) & 6 | (uint)(uVar18 >> 4) & 1;
  blockMode.weightGridHeight = (int)local_9b0;
  if ((uVar34 & 0x180) != 0x100) goto LAB_01627099;
  blockMode.isDualPlane = false;
  local_9f8 = (ulong)local_9f8._4_4_ << 0x20;
LAB_0162721f:
  switch(uVar30) {
  case 2:
    blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
    blockMode.weightISEParams.numBits = 1;
    bVar5 = false;
    uVar22 = 1;
    local_a68 = CONCAT44(local_a68._4_4_,1);
    break;
  case 3:
    blockMode.weightISEParams.mode = ISEMODE_TRIT;
    blockMode.weightISEParams.numBits = 0;
    local_a68 = (ulong)local_a68._4_4_ << 0x20;
    bVar5 = true;
    uVar22 = 0;
    goto LAB_016272e8;
  case 4:
    blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
    blockMode.weightISEParams.numBits = 2;
    goto LAB_016272a6;
  case 5:
    local_a80 = 1;
    blockMode.weightISEParams.mode = ISEMODE_QUINT;
    blockMode.weightISEParams.numBits = 0;
    local_a68 = (ulong)local_a68._4_4_ << 0x20;
    bVar5 = true;
    uVar22 = 0;
    bVar40 = true;
    goto LAB_0162731d;
  case 6:
    blockMode.weightISEParams.mode = ISEMODE_TRIT;
    blockMode.weightISEParams.numBits = 1;
    bVar5 = false;
    uVar22 = 1;
    local_a68 = CONCAT44(local_a68._4_4_,1);
LAB_016272e8:
    bVar40 = true;
    goto LAB_01627314;
  case 7:
    blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
    blockMode.weightISEParams.numBits = 3;
    bVar5 = false;
    local_a68 = (ulong)local_a68._4_4_ << 0x20;
    uVar22 = 3;
    break;
  default:
switchD_016270d7_default:
    blockMode.weightISEParams.mode = ISEMODE_PLAIN_BIT;
    blockMode.weightISEParams.numBits = 0;
    local_a68 = (ulong)local_a68._4_4_ << 0x20;
    bVar5 = true;
    uVar22 = 0;
  }
LAB_0162730c:
  bVar40 = false;
LAB_01627314:
  local_a80 = 0;
LAB_0162731d:
  blockMode.isError = false;
  iVar24 = (int)local_9b0 * (int)local_a30 << (sbyte)local_9f8;
  local_990 = CONCAT44(local_990._4_4_,iVar24);
  iVar24 = computeNumRequiredBits(&blockMode.weightISEParams,iVar24);
  if (((blockHeight < (int)local_9b0) || ((int)local_a20 < (int)local_a30)) ||
     ((0x40 < (uint)local_990 || (iVar24 - 0x61U < 0xffffffb7)))) goto LAB_01627606;
  uVar18 = uVar37 >> 0xb;
  uVar7 = (uint)uVar18 & 3;
  local_9a8 = (ulong)uVar7;
  local_9e8 = uVar7 + 1;
  if (local_9e8 == 4) {
    if ((byte)local_9f8 != '\0') goto LAB_01627606;
LAB_016273a4:
    bVar41 = (uVar37 & 0x1800000) == 0;
    uVar32 = 0xffffffe3;
    if (!bVar41) {
      uVar32 = (ulong)(local_9e8 * -3 - 0x19);
    }
  }
  else {
    if ((uVar18 & 3) != 0) goto LAB_016273a4;
    uVar32 = 0xffffffffffffffef;
    bVar41 = true;
  }
  uVar30 = (((uint)local_9f8 ^ 1) & 0xff) * 2 - iVar24;
  if (local_9e8 == 4 || bVar41 != false) {
    iVar28 = (uint)bVar41 * 8 + -7;
LAB_0162743a:
    local_980 = (ulong)(uint)(iVar28 - iVar24);
    if ((uVar18 & 3) != 0) {
      iVar24 = (iVar28 - iVar24) + 0x7f;
      goto LAB_01627448;
    }
    colorEndpointModes[0] = uVar34 >> 0xd & 0xf;
    local_9e4 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar24 >> 8),1);
    uVar18 = 1;
  }
  else {
    if (local_9e8 != 3) {
      iVar28 = -(uint)(local_9e8 == 2);
      goto LAB_0162743a;
    }
    local_980 = (ulong)(-iVar24 - 4);
    iVar24 = 0x7b - iVar24;
LAB_01627448:
    uVar18 = (ulong)local_9e8;
    if ((uVar37 >> 0x17 & 3) == 0) {
      for (uVar37 = 0; uVar18 != uVar37; uVar37 = uVar37 + 1) {
        colorEndpointModes[uVar37] = uVar34 >> 0x19 & 0xf;
      }
      local_9e4 = 0;
    }
    else {
      iVar28 = 0x19;
      iVar11 = 0;
      for (lVar29 = 0; local_9a8 * 2 + 2 != lVar29; lVar29 = lVar29 + 2) {
        iVar13 = (int)lVar29;
        iVar12 = iVar24 + -4;
        if (uVar7 + iVar13 + 1 < 4) {
          iVar12 = 0x19;
        }
        iVar8 = uVar7 + iVar13 + iVar12 + 1;
        iVar12 = uVar7 + 0x1b;
        if (3 < uVar7 + iVar13 + 2) {
          iVar12 = iVar24 + uVar7 + -2;
        }
        *(uint *)((long)colorEndpointModes + lVar29 * 2) =
             ((((uint)(uVar37 >> 0x17) & 3) - 1) +
             (uint)((*(ulong *)((long)local_9e0 + (long)(iVar28 / 0x40) * 8) >>
                     ((long)(iVar11 + 0x19) % 0x40 & 0x3fU) & 1) != 0)) * 4 +
             ((uint)(*(ulong *)((long)local_9e0 + (long)((iVar12 + iVar13) / 0x40) * 8) >>
                    ((byte)((iVar12 + iVar13) % 0x40) & 0x3f)) & 1) * 2 |
             (uint)((*(ulong *)((long)local_9e0 + (long)(iVar8 / 0x40) * 8) >>
                     ((long)iVar8 % 0x40 & 0x3fU) & 1) != 0);
        iVar11 = iVar11 + 1;
        iVar28 = iVar28 + 1;
      }
      local_9e4 = 0;
      local_a60 = uVar32;
      local_a50 = (ulong)uVar30;
      local_9d8 = uVar22;
    }
  }
  dVar26 = uVar30 + (int)uVar32 + 0x7e;
  uVar34 = 0;
  for (uVar37 = 0; uVar18 != uVar37; uVar37 = uVar37 + 1) {
    uVar34 = uVar34 + (colorEndpointModes[uVar37] >> 2) * 2 + 2;
  }
  local_a38 = uVar35;
  if (((int)uVar34 < 0x13) &&
     ((int)(((int)(uVar34 * 0xd) / 5 + 1) - (uint)((int)(uVar34 * 0xd) % 5 == 0)) <= (int)dVar26)) {
    lVar29 = 0;
    local_9d8 = uVar22;
    do {
      Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)((long)colorEndpoints[0].e0.m_data + lVar29));
      Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)((long)colorEndpoints[0].e1.m_data + lVar29));
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x80);
    IVar14 = computeMaximumRangeISEParams(dVar26,uVar34);
    rgba[2] = 0x1d;
    if ((char)local_9e4 != '\0') {
      rgba[2] = 0x11;
    }
    rgba[0] = local_9e0[0];
    rgba[1] = local_9e0[1];
    local_7a8[0] = true;
    local_7a4 = 0;
    local_940 = IVar14;
    rgba[3] = dVar26;
    decodeISE((ISEDecodedResult *)texelWeights,uVar34,(BitAccessStream *)rgba,&local_940);
    if (IVar14.mode < ISEMODE_PLAIN_BIT) {
      uVar7 = (-1 - (uint)(IVar14.mode == ISEMODE_TRIT)) + IVar14.numBits * 2;
      uVar22 = 0;
      uVar37 = (ulong)uVar34;
      if ((int)uVar34 < 1) {
        uVar37 = uVar22;
      }
      iVar24 = *(int *)(astc::(anonymous_namespace)::
                        unquantizeColorEndpoints(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,int,tcu::astc::(anonymous_namespace)::ISEParams_const&)
                        ::Ca + (long)(int)uVar7 * 4);
      pdVar23 = texelWeights[0].w + 1;
      for (; uVar37 != uVar22; uVar22 = uVar22 + 1) {
        uVar30 = ((TexelWeightPair *)(pdVar23 + -1))->w[0];
        uVar34 = 0;
        if ((uVar7 < 2) || (uVar34 = 0xffffffff, 8 < uVar7 - 2)) goto LAB_01627877;
        uVar33 = uVar30 >> 1 & 1;
        uVar21 = uVar30 >> 2 & 1;
        uVar38 = uVar30 >> 3 & 1;
        uVar36 = uVar30 >> 4 & 1;
        uVar35 = local_a38;
        switch(uVar7) {
        case 2:
          uVar34 = uVar33 * 0x116;
          break;
        case 3:
          uVar34 = uVar33 * 0x10c;
          break;
        case 4:
          iVar28 = (uVar33 << 7 | uVar21 << 8) + uVar21 * 8 + uVar33 * 4;
          goto LAB_016277af;
        case 5:
          uVar34 = (uVar33 << 7 | uVar21 << 8) + uVar21 * 4 + uVar33 * 2;
          goto LAB_01627817;
        case 6:
          iVar28 = (uVar33 << 6 | uVar21 << 7 | uVar38 << 8) + uVar38 * 4;
LAB_016277af:
          uVar34 = iVar28 + uVar21 * 2 | uVar33;
          break;
        case 7:
          uVar34 = (uVar33 << 6 | uVar21 << 7 | uVar38 << 8) + uVar38 * 2;
LAB_01627817:
          uVar34 = uVar34 | uVar21;
          break;
        case 8:
          uVar34 = (uVar33 << 5 | uVar21 << 6 | uVar38 << 7 | uVar36 << 8) + uVar36 * 2 | uVar38;
          break;
        case 9:
          uVar34 = uVar33 << 5 | uVar21 << 6 | uVar38 << 7 | uVar36 << 8 | uVar36;
          break;
        case 10:
          uVar34 = uVar30 >> 5 & 1;
          uVar34 = uVar33 << 4 | uVar21 << 5 | uVar38 << 6 | uVar36 << 7 | uVar34 << 8 | uVar34;
        }
LAB_01627877:
        rgba[uVar22] = -(uVar30 & 1) & 0x80 |
                       (*pdVar23 * iVar24 + uVar34 ^ -(uVar30 & 1) & 0x1ff) >> 2;
        pdVar23 = pdVar23 + 3;
      }
    }
    else {
      uVar22 = 0;
      uVar37 = (ulong)uVar34;
      if ((int)uVar34 < 1) {
        uVar37 = uVar22;
      }
      pdVar23 = texelWeights[1].w;
      for (; uVar37 != uVar22; uVar22 = uVar22 + 1) {
        dVar26 = bitReplicationScale(*pdVar23,IVar14.numBits,8);
        rgba[uVar22] = dVar26;
        pdVar23 = pdVar23 + 3;
      }
    }
    uVar37 = 0;
    uVar22 = 0;
    e1 = &colorEndpoints[0].e1;
    do {
      uVar32 = local_990;
      if (uVar18 == uVar37) {
        iVar24 = (uint)local_990;
        texelWeights[1].w[1] = computeNumRequiredBits(&blockMode.weightISEParams,(uint)local_990);
        texelWeights[0].w[0] = local_9e0[0];
        texelWeights[0].w[1] = local_9e0[1];
        texelWeights[1].w[0] = 0x7f;
        texelWeights[2].w[0]._0_1_ = 0;
        texelWeights[2].w[1] = 0;
        decodeISE((ISEDecodedResult *)rgba,iVar24,(BitAccessStream *)texelWeights,
                  &blockMode.weightISEParams);
        uVar32 = uVar32 & 0xffffffff;
        if (bVar40) {
          uVar34 = local_a80 + (int)local_9d8 * 2;
          if (bVar5) {
            puVar16 = astc::(anonymous_namespace)::
                      unquantizeWeights(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,tcu::astc::(anonymous_namespace)::ASTCBlockMode_const&)
                      ::map1;
            if (uVar34 == 0) {
              puVar16 = astc::(anonymous_namespace)::
                        unquantizeWeights(unsigned_int*,tcu::astc::(anonymous_namespace)::ISEDecodedResult_const*,tcu::astc::(anonymous_namespace)::ASTCBlockMode_const&)
                        ::map0;
            }
            puVar19 = rgba + 2;
            for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
              (&v0)[uVar37] = *(deInt32 *)(puVar16 + (ulong)*puVar19 * 4);
              puVar19 = puVar19 + 3;
            }
          }
          else {
            iVar24 = *(int *)(&DAT_019242f8 + (ulong)uVar34 * 4);
            pdVar23 = rgba + 1;
            for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
              uVar7 = pdVar23[-1];
              uVar30 = 0;
              if ((char)local_a68 == '\0') {
                uVar21 = uVar7 >> 1 & 1;
                if (uVar34 == 6) {
                  uVar30 = uVar7 >> 2 & 1;
                  uVar30 = (uVar21 << 5 | uVar30 << 6) + uVar30 * 2 | uVar21;
                }
                else if (uVar34 == 5) {
                  uVar30 = uVar21 * 0x42;
                }
                else {
                  uVar30 = 0xffffffff;
                  if (uVar34 == 4) {
                    uVar30 = uVar21 * 0x45;
                  }
                }
              }
              (&v0)[uVar37] =
                   -(uVar7 & 1) & 0x20 | (*pdVar23 * iVar24 + uVar30 ^ -(uVar7 & 1) & 0x7f) >> 2;
              pdVar23 = pdVar23 + 3;
            }
          }
        }
        else {
          pdVar23 = rgba + 2;
          for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
            dVar26 = bitReplicationScale(*pdVar23,(int)local_9d8,6);
            (&v0)[uVar37] = dVar26;
            pdVar23 = pdVar23 + 3;
          }
        }
        for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
          (&v0)[uVar37] = ((&v0)[uVar37] + 1U) - (uint)((uint)(&v0)[uVar37] < 0x21);
        }
        for (; uVar32 < 0x40; uVar32 = uVar32 + 1) {
          (&v0)[uVar32] = -1;
        }
        iVar28 = (int)local_a20;
        iVar11 = (int)uVar35;
        iVar24 = 0;
        local_990 = 0;
        if (0 < iVar28) {
          local_990 = local_a20 & 0xffffffff;
        }
        local_9ec = 0;
        if (0 < iVar11) {
          local_9ec = iVar11;
        }
        iVar13 = (int)local_a30;
        uVar34 = ((int)local_9b0 + -1) *
                 (((int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar35 & 0xffffffff) / 2) +
                  0x400) / (iVar11 + -1));
        local_9b0 = (ulong)uVar34;
        for (iVar11 = 0; iVar11 != local_9ec; iVar11 = iVar11 + 1) {
          uVar7 = uVar34 * iVar11 + 0x20;
          uVar30 = uVar7 >> 6 & 0xf;
          local_a68 = (ulong)uVar30;
          uVar7 = (uVar7 >> 10) * iVar13;
          local_a50 = (ulong)uVar7;
          uVar37 = 0;
          iVar12 = iVar24;
          while (uVar35 = uVar37, uVar35 != local_990) {
            local_a60 = CONCAT44(local_a60._4_4_,iVar12);
            uVar21 = (iVar13 + -1) *
                     (((int)((long)((ulong)(uint)(iVar28 >> 0x1f) << 0x20 | local_a20 & 0xffffffff)
                            / 2) + 0x400) / (iVar28 + -1)) * (int)uVar35 + 0x20;
            uVar33 = uVar21 >> 10;
            uVar36 = uVar21 >> 6 & 0xf;
            uVar21 = uVar36 * uVar30 + 8 >> 4;
            iVar8 = uVar33 + uVar7;
            for (lVar29 = 0; (local_9f8 & 0xff) + 1 != lVar29; lVar29 = lVar29 + 1) {
              iVar3 = (int)lVar29;
              texelWeights[iVar12].w[lVar29] =
                   (&v0)[(iVar8 + iVar13 << ((byte)local_9f8 & 0x1f)) + iVar3 & 0x3f] *
                   (uVar30 - uVar21) +
                   (&v0)[(uVar33 + uVar7 + 1 << ((byte)local_9f8 & 0x1f)) + iVar3 & 0x3f] *
                   (uVar36 - uVar21) +
                   (&v0)[(iVar8 << ((byte)local_9f8 & 0x1f)) + iVar3 & 0x3f] *
                   ((uVar21 - (uVar30 + uVar36)) + 0x10) +
                   (&v0)[(iVar13 + iVar8 + 1 << ((byte)local_9f8 & 0x1f)) + iVar3 & 0x3f] * uVar21 +
                   8 >> 4;
            }
            iVar12 = iVar12 + 1;
            local_9d8 = uVar35;
            uVar37 = uVar35 + 1;
          }
          iVar24 = iVar24 + iVar28;
          uVar35 = local_a38;
        }
        uVar37 = 0xffffffff;
        if ((byte)local_9f8 != 0) {
          dVar26 = Block128::getBits((Block128 *)local_9e0,(int)local_980 + 0x7d,
                                     (int)local_980 + 0x7e);
          uVar37 = (ulong)dVar26;
        }
        uVar34 = -(uint)((uint)local_9a8 == 0) | *(uint *)local_9e0 >> 0xd & 0x3ff;
        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
          if (colorEndpointModes[uVar22] - 2 < 0xe) {
            uVar27 = (&DAT_01924314)[colorEndpointModes[uVar22] - 2];
          }
          else {
            uVar27 = 0;
          }
          *(undefined1 *)((long)rgba + uVar22) = uVar27;
        }
        local_a68 = CONCAT71(local_a68._1_7_,(int)uVar35 * (int)local_a20 < 0x1f);
        uVar7 = (local_9e8 * 0x400 + uVar34) - 0x400;
        uVar7 = (uVar7 >> 0xf ^ uVar7) * -0x1121f76f;
        uVar7 = (uVar7 >> 5 ^ uVar7) * 0x10001;
        uVar7 = uVar7 >> 7 ^ uVar7;
        uVar7 = uVar7 >> 3 ^ uVar7;
        uVar7 = uVar7 << 6 ^ uVar7;
        uVar33 = uVar7 >> 0x11 ^ uVar7;
        uVar21 = uVar33 >> 8 & 0xf;
        uVar36 = uVar33 >> 0xc & 0xf;
        uVar38 = uVar7 >> 0x18 & 0xf;
        uVar30 = uVar33 >> 4 & 0xf;
        bVar17 = (uVar34 & 2) == 0 | 4;
        bVar20 = (local_9e8 == 3) + 5;
        bVar25 = bVar20;
        if ((uVar34 & 1) == 0) {
          bVar25 = bVar17;
          bVar17 = bVar20;
        }
        local_a44 = uVar30 * uVar30 >> bVar25;
        local_9b0 = CONCAT44(local_9b0._4_4_,uVar21 * uVar21 >> bVar17);
        local_a24 = uVar36 * uVar36 >> bVar25;
        local_980 = CONCAT44(local_980._4_4_,uVar38 * uVar38 >> bVar17);
        local_95c = (uVar7 >> 0x1c) * (uVar7 >> 0x1c) >> bVar25;
        local_960 = uVar33 >> 0xe;
        uVar34 = uVar7 >> 0x14 & 0xf;
        local_964 = uVar34 * uVar34 >> bVar25;
        uVar34 = uVar7 >> 0x10 & 0xf;
        local_9c0 = CONCAT44(local_9c0._4_4_,uVar34 * uVar34 >> bVar17);
        local_968 = uVar33 >> 10;
        local_96c = uVar33 >> 6;
        local_a58 = uVar33 >> 2;
        local_a38 = CONCAT71(local_a38._1_7_,(char)local_984) ^ 1;
        local_970 = (int)local_a20 * 4;
        local_9a0 = 0;
        iVar24 = 0;
        DVar9 = DECOMPRESS_RESULT_VALID_BLOCK;
        do {
          if (iVar24 == local_9ec) {
            return DVar9;
          }
          uVar35 = (ulong)(uint)(iVar24 * (int)local_a20);
          local_978 = CONCAT44(local_978._4_4_,iVar24);
          iVar24 = iVar24 << ((byte)local_a68 & 0x1f);
          iVar28 = iVar24 * local_a44 + local_960;
          local_9e0[0] = iVar24 * local_a24 + local_968;
          iVar11 = iVar24 * local_964 + local_96c;
          local_998 = (UVec4 *)CONCAT44(local_998._4_4_,iVar24 * local_95c + local_a58);
          uVar18 = local_9a0;
          local_9f8 = uVar35;
          for (local_a50 = 0; pvVar6 = local_a00, iVar24 = (int)uVar18, local_a50 != local_990;
              local_a50 = local_a50 + 1) {
            if ((char)local_9e4 == '\0') {
              iVar13 = (int)local_a50 << ((byte)local_a68 & 0x1f);
              uVar34 = 0;
              if ((uint)local_9a8 < 2) {
                uVar7 = 0;
              }
              else {
                uVar7 = iVar13 * (int)local_9c0 + iVar11 & 0x3f;
                uVar34 = 0;
                if (local_9e8 != 3) {
                  uVar34 = iVar13 * (int)local_980 + (int)local_998 & 0x3f;
                }
              }
              uVar21 = iVar13 * ((uVar33 & 0xf) * (uVar33 & 0xf) >> bVar17) + iVar28 & 0x3f;
              uVar30 = iVar13 * (int)local_9b0 + local_9e0[0] & 0x3f;
              if (((uVar30 <= uVar21) && (uVar7 <= uVar21)) && (uVar34 <= uVar21))
              goto LAB_01628e68;
              if ((uVar30 < uVar7) || (lVar29 = 1, uVar30 < uVar34)) {
                lVar29 = (ulong)(uVar7 < uVar34) + 2;
              }
            }
            else {
LAB_01628e68:
              lVar29 = 0;
            }
            iVar13 = (int)uVar35 + (int)local_a50;
            if (((char)local_984 == '\0') || ((*(byte *)((long)rgba + lVar29) & 1) == 0)) {
              local_a30 = CONCAT44(local_a30._4_4_,iVar24);
              lVar15 = (long)iVar24;
              local_a60 = lVar15 + (long)local_a00;
              bVar25 = *(byte *)((long)rgba + lVar29) & (byte)local_a38;
              local_9d8 = lVar29;
              for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
                if ((bVar25 == 0) || ((uVar35 == 3 && (colorEndpointModes[local_9d8] == 0xe)))) {
                  uVar34 = colorEndpoints[lVar29].e0.m_data[uVar35];
                  uVar7 = colorEndpoints[lVar29].e1.m_data[uVar35];
                  uVar21 = uVar34 << 8;
                  uVar30 = uVar7;
                  if ((char)local_a40 != '\0') {
                    uVar34 = 0x80;
                    uVar30 = 0x80;
                  }
                  uVar34 = (uVar7 << 8 | uVar30) * texelWeights[iVar13].w[uVar37 == uVar35] +
                           (0x40 - texelWeights[iVar13].w[uVar37 == uVar35]) * (uVar34 | uVar21) +
                           0x20;
                  if ((char)local_a40 == '\0') {
                    uVar34 = uVar34 >> 6;
                    fVar42 = 1.0;
                    if (uVar34 != 0xffff) {
                      fVar42 = (float)uVar34 * 1.5258789e-05;
                    }
                    *(float *)((long)pvVar6 + uVar35 * 4 + lVar15 * 4) = fVar42;
                  }
                  else {
                    *(char *)(local_a60 + uVar35) = (char)(uVar34 >> 0xe);
                  }
                }
                else {
                  uVar7 = (texelWeights[iVar13].w[uVar37 == uVar35] *
                           colorEndpoints[lVar29].e1.m_data[uVar35] +
                          (0x40 - texelWeights[iVar13].w[uVar37 == uVar35]) *
                          colorEndpoints[lVar29].e0.m_data[uVar35]) * 0x10 + 0x20;
                  uVar34 = uVar7 >> 6 & 0x7ff;
                  if (uVar34 < 0x200) {
                    uVar34 = uVar34 * 3;
                  }
                  else if (uVar34 < 0x600) {
                    uVar34 = uVar34 * 4 - 0x200;
                  }
                  else {
                    uVar34 = uVar34 * 5 - 0x800;
                  }
                  uVar34 = (uVar34 >> 3) + (uVar7 >> 7 & 0x7c00);
                  val16 = 0x7bff;
                  if ((~uVar34 & 0x7c00) != 0) {
                    val16 = (deFloat16)uVar34;
                  }
                  fVar42 = deFloat16To32(val16);
                  *(float *)((long)pvVar6 + uVar35 * 4 + lVar15 * 4) = fVar42;
                }
              }
              uVar35 = local_9f8;
              iVar24 = (int)local_a30;
            }
            else {
              lVar29 = (long)(iVar13 * 4);
              if ((char)local_a40 == '\0') {
                *(undefined4 *)((long)local_a00 + lVar29 * 4) = 0x3f800000;
                *(undefined4 *)((long)local_a00 + (lVar29 + 1) * 4) = 0;
                *(undefined4 *)((long)local_a00 + (lVar29 + 2) * 4) = 0x3f800000;
                *(undefined4 *)((long)local_a00 + (lVar29 + 3) * 4) = 0x3f800000;
              }
              else {
                *(undefined1 *)((long)local_a00 + lVar29) = 0xff;
                *(undefined1 *)((long)local_a00 + lVar29 + 1) = 0;
                *(undefined1 *)((long)local_a00 + lVar29 + 2) = 0xff;
                *(undefined1 *)((long)local_a00 + lVar29 + 3) = 0xff;
              }
              DVar9 = DECOMPRESS_RESULT_ERROR;
            }
            uVar18 = (ulong)(iVar24 + 4);
          }
          iVar24 = (int)local_978 + 1;
          local_9a0 = (ulong)(uint)((int)local_9a0 + local_970);
        } while( true );
      }
      uVar32 = (ulong)colorEndpointModes[uVar37];
      if (0xf < uVar32) goto LAB_016284cb;
      e0 = (ColorEndpointPair *)(e1 + -1);
      lVar15 = (long)(int)uVar22;
      lVar29 = lVar15 * 4;
      pdVar23 = rgba + lVar15;
      switch(uVar32) {
      case 0:
        dVar26 = *pdVar23;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        uVar34 = rgba[lVar15 + 1];
        e1->m_data[0] = uVar34;
        e1->m_data[1] = uVar34;
        e1->m_data[2] = uVar34;
        e1->m_data[3] = 0xff;
        break;
      case 1:
        uVar7 = rgba[lVar15 + 1] & 0xc0 | *pdVar23 >> 2;
        uVar34 = (rgba[lVar15 + 1] & 0x3f) + uVar7;
        if (0xfe < uVar34) {
          uVar34 = 0xff;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar7;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar7;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        e1->m_data[0] = uVar34;
        e1->m_data[1] = uVar34;
        e1->m_data[2] = uVar34;
        e1->m_data[3] = 0xff;
        break;
      case 2:
        uVar7 = *pdVar23 * 0x10;
        uVar21 = rgba[lVar15 + 1] * 0x10;
        uVar30 = uVar7 - 8;
        uVar34 = uVar21 + 8;
        if (*pdVar23 <= rgba[lVar15 + 1]) {
          uVar30 = uVar21;
          uVar34 = uVar7;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar34;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar34;
        uVar34 = 0x780;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
        e1->m_data[0] = uVar30;
        e1->m_data[1] = uVar30;
        goto LAB_01628188;
      case 3:
        bVar41 = -1 < (char)*pdVar23;
        uVar34 = 0x1fc;
        if (bVar41) {
          uVar34 = 0xfe;
        }
        uVar7 = 0x7c;
        if (bVar41) {
          uVar7 = 0x1e;
        }
        uVar30 = *pdVar23 << (2U - bVar41 & 0x1f) & uVar34 |
                 (bVar41 + 0xe) * 0x100 & rgba[lVar15 + 1] << 4;
        uVar34 = (rgba[lVar15 + 1] << (2U - bVar41 & 0x1f) & uVar7) + uVar30;
        if (0xffe < uVar34) {
          uVar34 = 0xfff;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0x780;
        e1->m_data[0] = uVar34;
        e1->m_data[1] = uVar34;
        e1->m_data[2] = uVar34;
        e1->m_data[3] = 0x780;
        break;
      case 4:
        dVar26 = *pdVar23;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = dVar26;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar26;
        uVar34 = rgba[lVar15 + 3];
        uVar7 = (uint)*(undefined8 *)(rgba + lVar15 + 1);
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] =
             (uint)((ulong)*(undefined8 *)(rgba + lVar15 + 1) >> 0x20);
        e1->m_data[0] = uVar7;
        e1->m_data[1] = uVar7;
        e1->m_data[2] = uVar7;
        goto LAB_0162818c;
      case 5:
        v0 = *pdVar23;
        v1 = rgba[lVar15 + 1];
        v2 = rgba[lVar15 + 2];
        v3 = rgba[lVar15 + 3];
        bitTransferSigned(&v1,&v0);
        bitTransferSigned(&v3,&v2);
        uVar34 = 0xff;
        if (v0 < 0xff) {
          uVar34 = v0;
        }
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        uVar7 = 0xff;
        if (v2 < 0xff) {
          uVar7 = v2;
        }
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar34;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar34;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar7;
        uVar34 = v0 + v1;
        if (0xfe < (int)uVar34) {
          uVar34 = 0xff;
        }
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        uVar7 = v2 + v3;
        if (0xfe < v2 + v3) {
          uVar7 = 0xff;
        }
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        e1->m_data[0] = uVar34;
        e1->m_data[1] = uVar34;
        e1->m_data[2] = uVar34;
        e1->m_data[3] = uVar7;
        break;
      case 6:
        dVar26 = rgba[lVar15 + 3];
        dVar1 = *pdVar23;
        uVar7 = rgba[lVar15 + 1];
        uVar30 = rgba[lVar15 + 2];
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar26 * dVar1 >> 8;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7 * dVar26 >> 8;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar26 * uVar30 >> 8;
        uVar34 = 0xff;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        goto LAB_01628181;
      case 7:
        local_9ec = *pdVar23 >> 6 & 3;
        uVar34 = 0;
        if (local_9ec != 3) {
          uVar34 = local_9ec;
        }
        uVar7 = rgba[lVar15 + 2] >> 6 & 2 | rgba[lVar15 + 1] >> 7 & 1;
        if (uVar7 != 3) {
          uVar34 = uVar7;
        }
        local_9a0 = CONCAT44(local_9a0._4_4_,uVar34);
        uVar34 = local_9ec == 3 | 4;
        if (uVar7 != 3) {
          uVar34 = local_9ec;
        }
        local_978 = (ulong)uVar34;
        local_a58 = *pdVar23 & 0x3f;
        local_a24 = rgba[lVar15 + 1] & 0x1f;
        local_a44 = rgba[lVar15 + 3] & 0x1f;
        local_a60 = uVar22;
        local_a50 = uVar32;
        local_9c0 = uVar37;
        local_998 = e1;
        DVar9 = (*(code *)(&DAT_01921ae8 + *(int *)(&DAT_01921ae8 + local_978 * 4)))();
        return DVar9;
      case 8:
        uVar34 = rgba[lVar15 + 1];
        uVar7 = rgba[lVar15 + 3];
        uVar30 = (&local_7a0)[lVar15 + -1];
        iVar24 = uVar30 + uVar34;
        uVar21 = rgba[lVar15 + 2];
        uVar33 = *(uint *)(local_7a8 + lVar29);
        if (iVar24 + uVar7 < uVar21 + *pdVar23 + uVar33) {
          v1 = iVar24 >> 1;
          local_9cc = (int)(uVar7 + uVar30) >> 1;
          local_9c4 = 0xff;
          local_a60 = uVar22;
          local_9c8 = uVar30;
          local_9c0 = uVar37;
          Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&v0);
          uVar37 = local_9c0;
          *(ulong *)(e0->e0).m_data = CONCAT44(iStack_934,v0);
          *(undefined8 *)((((ColorEndpointPair *)(e1 + -1))->e0).m_data + 2) = aiStack_930._0_8_;
          local_9c8 = *(uint *)(local_7a8 + lVar29);
          v1 = (int)(*pdVar23 + local_9c8) >> 1;
          local_9cc = (int)(rgba[lVar15 + 2] + local_9c8) >> 1;
          local_9c4 = 0xff;
          Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&v0);
          *(ulong *)e1->m_data = CONCAT44(iStack_934,v0);
          *(undefined8 *)(e1->m_data + 2) = aiStack_930._0_8_;
          uVar22 = local_a60;
        }
        else {
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar23;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar21;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar33;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
          e1->m_data[0] = uVar34;
          e1->m_data[1] = uVar7;
          e1->m_data[2] = uVar30;
          e1->m_data[3] = 0xff;
          local_a60 = uVar22;
        }
        break;
      case 9:
        v0 = *pdVar23;
        v1 = rgba[lVar15 + 1];
        v2 = rgba[lVar15 + 2];
        v3 = rgba[lVar15 + 3];
        v4 = *(deInt32 *)(local_7a8 + lVar29);
        v5 = (&local_7a0)[lVar15 + -1];
        local_a60 = uVar22;
        bitTransferSigned(&v1,&v0);
        bitTransferSigned(&v3,&v2);
        bitTransferSigned(&v5,&v4);
        if (v3 + v1 + v5 < 0) {
          uVar30 = v5 + v4;
          uVar7 = (int)(v1 + v0 + uVar30) >> 1;
          uVar34 = (int)(v3 + v2 + uVar30) >> 1;
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          if (0xfe < (int)uVar34) {
            uVar34 = 0xff;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          if (0xfe < (int)uVar30) {
            uVar30 = 0xff;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          uVar36 = v0 + v4 >> 1;
          uVar21 = v2 + v4 >> 1;
          uVar33 = v4;
        }
        else {
          uVar7 = 0xff;
          if (v0 < 0xff) {
            uVar7 = v0;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          uVar34 = 0xff;
          if (v2 < 0xff) {
            uVar34 = v2;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar30 = 0xff;
          if (v4 < 0xff) {
            uVar30 = v4;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          uVar36 = v1 + v0;
          uVar21 = v3 + v2;
          uVar33 = v5 + v4;
        }
        if (0xfe < (int)uVar36) {
          uVar36 = 0xff;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar7;
        if (0xfe < (int)uVar21) {
          uVar21 = 0xff;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar34;
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        if (0xfe < (int)uVar33) {
          uVar33 = 0xff;
        }
        if ((int)uVar33 < 1) {
          uVar33 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar30;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = 0xff;
        e1->m_data[0] = uVar36;
        e1->m_data[1] = uVar21;
        e1->m_data[2] = uVar33;
        e1->m_data[3] = 0xff;
        uVar22 = local_a60;
        break;
      case 10:
        dVar26 = rgba[lVar15 + 3];
        dVar1 = *pdVar23;
        uVar7 = rgba[lVar15 + 1];
        uVar30 = rgba[lVar15 + 2];
        uVar34 = *(uint *)(local_7a8 + lVar29);
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = dVar26 * dVar1 >> 8;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7 * dVar26 >> 8;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = dVar26 * uVar30 >> 8;
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar34;
        uVar34 = (&local_7a0)[lVar15 + -1];
LAB_01628181:
        e1->m_data[0] = dVar1;
        e1->m_data[1] = uVar7;
LAB_01628188:
        e1->m_data[2] = uVar30;
        goto LAB_0162818c;
      case 0xb:
        local_a50 = uVar32;
        decodeHDREndpointMode11
                  ((UVec4 *)e0,e1,*pdVar23,rgba[lVar15 + 1],rgba[lVar15 + 2],rgba[lVar15 + 3],
                   *(deUint32 *)(local_7a8 + lVar29),(&local_7a0)[lVar15 + -1]);
        uVar32 = local_a50;
        break;
      case 0xc:
        uVar34 = rgba[lVar15 + 1];
        uVar7 = rgba[lVar15 + 3];
        uVar30 = (&local_7a0)[lVar15 + -1];
        iVar28 = uVar30 + uVar34;
        uVar21 = rgba[lVar15 + 2];
        uVar33 = *(uint *)(local_7a8 + lVar29);
        iVar24 = uVar33 + *pdVar23;
        if (iVar28 + uVar7 < iVar24 + uVar21) {
          uVar34 = iVar28 >> 1;
          if (0xfe < (int)uVar34) {
            uVar34 = 0xff;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar7 = (int)(uVar7 + uVar30) >> 1;
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          if (0xfe < (int)uVar30) {
            uVar30 = 0xff;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          uVar36 = local_79c[lVar15];
          if (0xfe < (int)uVar36) {
            uVar36 = 0xff;
          }
          if ((int)uVar36 < 1) {
            uVar36 = 0;
          }
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar30;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar36;
          uVar34 = iVar24 >> 1;
          if (0xfe < (int)uVar34) {
            uVar34 = 0xff;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar7 = (&local_7a0)[lVar15];
          uVar30 = (int)(uVar21 + uVar33) >> 1;
          if (0xfe < (int)uVar30) {
            uVar30 = 0xff;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          if (0xfe < (int)uVar33) {
            uVar33 = 0xff;
          }
          if ((int)uVar33 < 1) {
            uVar33 = 0;
          }
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          e1->m_data[0] = uVar34;
          e1->m_data[1] = uVar30;
          e1->m_data[2] = uVar33;
          e1->m_data[3] = uVar7;
          local_a60 = uVar22;
        }
        else {
          uVar36 = (&local_7a0)[lVar15];
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = *pdVar23;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar21;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar33;
          (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar36;
          uVar21 = local_79c[lVar15];
          e1->m_data[0] = uVar34;
          e1->m_data[1] = uVar7;
          e1->m_data[2] = uVar30;
          e1->m_data[3] = uVar21;
          local_a60 = uVar22;
        }
        break;
      case 0xd:
        v0 = *pdVar23;
        v1 = rgba[lVar15 + 1];
        v2 = rgba[lVar15 + 2];
        v3 = rgba[lVar15 + 3];
        v4 = *(deInt32 *)(local_7a8 + lVar29);
        v5 = (&local_7a0)[lVar15 + -1];
        v6 = (&local_7a0)[lVar15];
        local_9b8 = local_79c[lVar15];
        local_a60 = uVar22;
        bitTransferSigned(&v1,&v0);
        bitTransferSigned(&v3,&v2);
        bitTransferSigned(&v5,&v4);
        bitTransferSigned((deInt32 *)&local_9b8,&v6);
        if (v3 + v1 + v5 < 0) {
          uVar30 = v5 + v4;
          uVar34 = (int)(v1 + v0 + uVar30) >> 1;
          uVar7 = (int)(v3 + v2 + uVar30) >> 1;
          if (0xfe < (int)uVar34) {
            uVar34 = 0xff;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          if (0xfe < (int)uVar7) {
            uVar7 = 0xff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          if (0xfe < (int)uVar30) {
            uVar30 = 0xff;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          uVar21 = local_9b8 + v6;
          if (0xfe < (int)(local_9b8 + v6)) {
            uVar21 = 0xff;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          uVar33 = v0 + v4 >> 1;
          uVar36 = v2 + v4 >> 1;
          uVar31 = v6;
          uVar38 = v4;
        }
        else {
          uVar34 = 0xff;
          if (v0 < 0xff) {
            uVar34 = v0;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar7 = 0xff;
          if (v2 < 0xff) {
            uVar7 = v2;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          uVar30 = 0xff;
          if (v4 < 0xff) {
            uVar30 = v4;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          uVar21 = 0xff;
          if (v6 < 0xff) {
            uVar21 = v6;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          uVar33 = v0 + v1;
          uVar36 = v3 + v2;
          uVar31 = v6 + local_9b8;
          uVar38 = v5 + v4;
          local_998 = e1;
        }
        uVar39 = 0xff;
        if (0xfe < (int)uVar33) {
          uVar33 = uVar39;
        }
        uVar10 = 0;
        if ((int)uVar33 < 1) {
          uVar33 = uVar10;
        }
        if (0xfe < (int)uVar36) {
          uVar36 = uVar39;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[0] = uVar34;
        if ((int)uVar36 < 1) {
          uVar36 = uVar10;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[1] = uVar7;
        if (0xfe < (int)uVar38) {
          uVar38 = uVar39;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[2] = uVar30;
        if ((int)uVar38 < 1) {
          uVar38 = uVar10;
        }
        if (0xfe < (int)uVar31) {
          uVar31 = uVar39;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar21;
        e1->m_data[0] = uVar33;
        e1->m_data[1] = uVar36;
        e1->m_data[2] = uVar38;
        e1->m_data[3] = uVar31;
        uVar22 = local_a60;
        local_9c0 = uVar37;
        break;
      case 0xe:
        local_a50 = uVar32;
        decodeHDREndpointMode11
                  ((UVec4 *)e0,e1,*pdVar23,rgba[lVar15 + 1],rgba[lVar15 + 2],rgba[lVar15 + 3],
                   *(deUint32 *)(local_7a8 + lVar29),(&local_7a0)[lVar15 + -1]);
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = (&local_7a0)[lVar15];
        uVar34 = local_79c[lVar15];
        uVar32 = local_a50;
LAB_0162818c:
        e1->m_data[3] = uVar34;
        break;
      case 0xf:
        uVar34 = (&local_7a0)[lVar15];
        uVar7 = local_79c[lVar15];
        local_a60 = uVar22;
        local_a50 = uVar32;
        decodeHDREndpointMode11
                  ((UVec4 *)e0,e1,*pdVar23,rgba[lVar15 + 1],rgba[lVar15 + 2],rgba[lVar15 + 3],
                   *(deUint32 *)(local_7a8 + lVar29),(&local_7a0)[lVar15 + -1]);
        uVar30 = uVar34 >> 7 & 1 | uVar7 >> 6 & 2;
        uVar34 = uVar34 & 0x7f;
        if (uVar30 == 3) {
          uVar34 = uVar34 << 5;
          uVar7 = (uVar7 & 0x7f) << 5;
        }
        else {
          sVar4 = (sbyte)uVar30;
          uVar30 = (uVar7 & 0x7f) << sVar4 + 1 & 0x780 | uVar34;
          uVar34 = uVar30 << (4U - sVar4 & 0x1f);
          uVar7 = ((0x3fU >> sVar4 & uVar7 ^ 0x20U >> sVar4) - (0x20U >> sVar4)) + uVar30 <<
                  (4U - sVar4 & 0x1f);
          if (0xffe < (int)uVar7) {
            uVar7 = 0xfff;
          }
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
        }
        (((ColorEndpointPair *)(e1 + -1))->e0).m_data[3] = uVar34;
        e1->m_data[3] = uVar7;
        uVar32 = local_a50;
        uVar22 = local_a60;
      }
LAB_016284cb:
      uVar22 = (ulong)((int)uVar22 + ((uint)(uVar32 >> 2) & 0x3fffffff) * 2 + 2);
      uVar37 = uVar37 + 1;
      e1 = e1 + 2;
    } while( true );
  }
LAB_01627606:
  setASTCErrorColorBlock(local_a00,(int)local_a20,blockHeight,(bool)(char)local_a40);
  return DECOMPRESS_RESULT_ERROR;
}

Assistant:

DecompressResult decompressBlock (void* dst, const Block128& blockData, int blockWidth, int blockHeight, bool isSRGB, bool isLDR)
{
	DE_ASSERT(isLDR || !isSRGB);

	// Decode block mode.

	const ASTCBlockMode blockMode = getASTCBlockMode(blockData.getBits(0, 10));

	// Check for block mode errors.

	if (blockMode.isError)
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Separate path for void-extent.

	if (blockMode.isVoidExtent)
		return decodeVoidExtentBlock(dst, blockData, blockWidth, blockHeight, isSRGB, isLDR);

	// Compute weight grid values.

	const int numWeights			= computeNumWeights(blockMode);
	const int numWeightDataBits		= computeNumRequiredBits(blockMode.weightISEParams, numWeights);
	const int numPartitions			= (int)blockData.getBits(11, 12) + 1;

	// Check for errors in weight grid, partition and dual-plane parameters.

	if (numWeights > 64								||
		numWeightDataBits > 96						||
		numWeightDataBits < 24						||
		blockMode.weightGridWidth > blockWidth		||
		blockMode.weightGridHeight > blockHeight	||
		(numPartitions == 4 && blockMode.isDualPlane))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute number of bits available for color endpoint data.

	const bool	isSingleUniqueCem			= numPartitions == 1 || blockData.getBits(23, 24) == 0;
	const int	numConfigDataBits			= (numPartitions == 1 ? 17 : isSingleUniqueCem ? 29 : 25 + 3*numPartitions) +
											  (blockMode.isDualPlane ? 2 : 0);
	const int	numBitsForColorEndpoints	= 128 - numWeightDataBits - numConfigDataBits;
	const int	extraCemBitsStart			= 127 - numWeightDataBits - (isSingleUniqueCem		? -1
																		: numPartitions == 4	? 7
																		: numPartitions == 3	? 4
																		: numPartitions == 2	? 1
																		: 0);
	// Decode color endpoint modes.

	deUint32 colorEndpointModes[4];
	decodeColorEndpointModes(&colorEndpointModes[0], blockData, numPartitions, extraCemBitsStart);

	const int numColorEndpointValues = computeNumColorEndpointValues(colorEndpointModes, numPartitions);

	// Check for errors in color endpoint value count.

	if (numColorEndpointValues > 18 || numBitsForColorEndpoints < deDivRoundUp32(13*numColorEndpointValues, 5))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute color endpoints.

	ColorEndpointPair colorEndpoints[4];
	computeColorEndpoints(&colorEndpoints[0], blockData, &colorEndpointModes[0], numPartitions, numColorEndpointValues,
						  computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues), numBitsForColorEndpoints);

	// Compute texel weights.

	TexelWeightPair texelWeights[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT];
	computeTexelWeights(&texelWeights[0], blockData, blockWidth, blockHeight, blockMode);

	// Set texel colors.

	const int		ccs						= blockMode.isDualPlane ? (int)blockData.getBits(extraCemBitsStart-2, extraCemBitsStart-1) : -1;
	const deUint32	partitionIndexSeed		= numPartitions > 1 ? blockData.getBits(13, 22) : (deUint32)-1;

	return setTexelColors(dst, &colorEndpoints[0], &texelWeights[0], ccs, partitionIndexSeed, numPartitions, blockWidth, blockHeight, isSRGB, isLDR, &colorEndpointModes[0]);
}